

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenMPIRToDOT.cpp
# Opt level: O2

void __thiscall
OpenMPClause::generateDOT
          (OpenMPClause *this,ofstream *dot_file,int depth,int index,string *parent_node)

{
  OpenMPDirective *this_00;
  pointer ppcVar1;
  allocator<char> local_229;
  ofstream *local_228;
  int local_21c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_218;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d8;
  string expr_name;
  string clause_kind;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_178;
  string indent;
  string current_line;
  string local_110;
  string local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  string local_b0;
  string local_90;
  string clause_label;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  current_line._M_dataplus._M_p = (pointer)&current_line.field_2;
  current_line._M_string_length = 0;
  current_line.field_2._M_local_buf[0] = '\0';
  clause_kind._M_dataplus._M_p = (pointer)&clause_kind.field_2;
  clause_kind._M_string_length = 0;
  clause_kind.field_2._M_local_buf[0] = '\0';
  indent._M_dataplus._M_p = (pointer)&indent.field_2;
  local_228 = dot_file;
  std::__cxx11::string::_M_construct((ulong)&indent,(char)depth);
  switch(this->kind) {
  case OMPC_if:
    break;
  case OMPC_num_threads:
    break;
  case OMPC_default:
    break;
  case OMPC_private:
    break;
  case OMPC_firstprivate:
    break;
  case OMPC_shared:
    break;
  default:
    puts("The clause enum is not supported yet.");
    goto LAB_001522fe;
  case OMPC_align:
    break;
  case OMPC_proc_bind:
    break;
  case OMPC_allocate:
    break;
  case OMPC_num_teams:
    break;
  case OMPC_thread_limit:
    break;
  case OMPC_collapse:
    break;
  case OMPC_ordered:
    break;
  case OMPC_nowait:
    break;
  case OMPC_order:
    break;
  case OMPC_safelen:
    break;
  case OMPC_simdlen:
    break;
  case OMPC_aligned:
    break;
  case OMPC_nontemporal:
    break;
  case OMPC_uniform:
    break;
  case OMPC_inbranch:
    break;
  case OMPC_notinbranch:
    break;
  case OMPC_bind:
    break;
  case OMPC_inclusive:
    break;
  case OMPC_exclusive:
    break;
  case OMPC_copyprivate:
    break;
  case OMPC_parallel:
    break;
  case OMPC_sections:
    break;
  case OMPC_for:
    break;
  case OMPC_do:
    break;
  case OMPC_taskgroup:
    break;
  case OMPC_initializer:
    break;
  case OMPC_final:
    break;
  case OMPC_untied:
    break;
  case OMPC_mergeable:
    break;
  case OMPC_priority:
    break;
  case OMPC_detach:
    break;
  case OMPC_grainsize:
    break;
  case OMPC_num_tasks:
    break;
  case OMPC_nogroup:
    break;
  case OMPC_reverse_offload:
    break;
  case OMPC_unified_address:
    break;
  case OMPC_unified_shared_memory:
    break;
  case OMPC_dynamic_allocators:
    break;
  case OMPC_map:
    break;
  case OMPC_use_device_ptr:
    break;
  case OMPC_use_device_addr:
    break;
  case OMPC_is_device_ptr:
    break;
  case OMPC_has_device_addr:
    break;
  case OMPC_uses_allocators:
    break;
  case OMPC_link:
    break;
  case OMPC_device_type:
    break;
  case OMPC_acq_rel:
    break;
  case OMPC_release:
    break;
  case OMPC_acquire:
    break;
  case OMPC_read:
    break;
  case OMPC_write:
    break;
  case OMPC_update:
    break;
  case OMPC_capture:
    break;
  case OMPC_seq_cst:
    break;
  case OMPC_relaxed:
    break;
  case OMPC_hint:
    break;
  case OMPC_destroy:
    break;
  case OMPC_threads:
    break;
  case OMPC_simd:
  }
  std::__cxx11::string::append((char *)&clause_kind);
LAB_001522fe:
  std::__cxx11::string::string((string *)&clause_label,(string *)&clause_kind);
  std::operator+(&local_d0,parent_node,"_");
  std::operator+(&local_178,&local_d0,&clause_kind);
  std::operator+(&local_218,&local_178,"_");
  std::__cxx11::to_string(&local_f0,depth);
  std::operator+(&local_1f8,&local_218,&local_f0);
  std::operator+(&local_1d8,&local_1f8,"_");
  std::__cxx11::to_string(&local_110,index);
  std::operator+(&expr_name,&local_1d8,&local_110);
  std::__cxx11::string::operator=((string *)&clause_kind,(string *)&expr_name);
  std::__cxx11::string::~string((string *)&expr_name);
  std::__cxx11::string::~string((string *)&local_110);
  std::__cxx11::string::~string((string *)&local_1d8);
  std::__cxx11::string::~string((string *)&local_1f8);
  std::__cxx11::string::~string((string *)&local_f0);
  std::__cxx11::string::~string((string *)&local_218);
  std::__cxx11::string::~string((string *)&local_178);
  std::__cxx11::string::~string((string *)&local_d0);
  std::operator+(&local_218,&indent,parent_node);
  std::operator+(&local_1f8,&local_218," -- ");
  std::operator+(&local_1d8,&local_1f8,&clause_kind);
  std::operator+(&expr_name,&local_1d8,"\n");
  std::__cxx11::string::operator=((string *)&current_line,(string *)&expr_name);
  std::__cxx11::string::~string((string *)&expr_name);
  std::__cxx11::string::~string((string *)&local_1d8);
  std::__cxx11::string::~string((string *)&local_1f8);
  std::__cxx11::string::~string((string *)&local_218);
  std::operator<<((ostream *)local_228,current_line._M_dataplus._M_p);
  std::__cxx11::string::append((char *)&indent);
  std::operator+(&local_218,&indent,&clause_kind);
  std::operator+(&local_1f8,&local_218," [label = \"");
  std::operator+(&local_1d8,&local_1f8,&clause_label);
  std::operator+(&expr_name,&local_1d8,"\"]\n");
  std::__cxx11::string::operator=((string *)&current_line,(string *)&expr_name);
  std::__cxx11::string::~string((string *)&expr_name);
  std::__cxx11::string::~string((string *)&local_1d8);
  std::__cxx11::string::~string((string *)&local_1f8);
  std::__cxx11::string::~string((string *)&local_218);
  std::operator<<((ostream *)local_228,current_line._M_dataplus._M_p);
  if ((this->kind == OMPC_default) &&
     (this_00 = *(OpenMPDirective **)&this[1].super_SourceLocation,
     this_00 != (OpenMPDirective *)0x0)) {
    std::__cxx11::string::string((string *)&local_90,(string *)&clause_kind);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_b0,"",(allocator<char> *)&expr_name);
    OpenMPDirective::generateDOT(this_00,local_228,depth + 1,0,&local_90,&local_b0);
    std::__cxx11::string::~string((string *)&local_b0);
    std::__cxx11::string::~string((string *)&local_90);
  }
  expr_name._M_dataplus._M_p = (pointer)&expr_name.field_2;
  expr_name._M_string_length = 0;
  expr_name.field_2._M_local_buf[0] = '\0';
  ppcVar1 = (this->expressions).super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  local_21c = 0;
  for (; ppcVar1 !=
         (this->expressions).super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl
         .super__Vector_impl_data._M_finish; ppcVar1 = ppcVar1 + 1) {
    std::operator+(&local_1f8,&clause_kind,"_expr");
    std::__cxx11::to_string(&local_218,local_21c);
    std::operator+(&local_1d8,&local_1f8,&local_218);
    std::__cxx11::string::operator=((string *)&expr_name,(string *)&local_1d8);
    std::__cxx11::string::~string((string *)&local_1d8);
    std::__cxx11::string::~string((string *)&local_218);
    std::__cxx11::string::~string((string *)&local_1f8);
    std::operator+(&local_178,&indent,&clause_kind);
    std::operator+(&local_218,&local_178," -- ");
    std::operator+(&local_1f8,&local_218,&expr_name);
    std::operator+(&local_1d8,&local_1f8,"\n");
    std::__cxx11::string::operator=((string *)&current_line,(string *)&local_1d8);
    std::__cxx11::string::~string((string *)&local_1d8);
    std::__cxx11::string::~string((string *)&local_1f8);
    std::__cxx11::string::~string((string *)&local_218);
    std::__cxx11::string::~string((string *)&local_178);
    std::operator<<((ostream *)local_228,current_line._M_dataplus._M_p);
    std::operator+(&local_110,&indent,"\t");
    std::operator+(&local_f0,&local_110,&expr_name);
    std::operator+(&local_d0,&local_f0," [label = \"");
    std::operator+(&local_178,&local_d0,"expr");
    std::operator+(&local_218,&local_178,"\\n ");
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,*ppcVar1,&local_229);
    std::operator+(&local_1f8,&local_218,&local_50);
    std::operator+(&local_1d8,&local_1f8,"\"]\n");
    std::__cxx11::string::operator=((string *)&current_line,(string *)&local_1d8);
    std::__cxx11::string::~string((string *)&local_1d8);
    std::__cxx11::string::~string((string *)&local_1f8);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&local_218);
    std::__cxx11::string::~string((string *)&local_178);
    std::__cxx11::string::~string((string *)&local_d0);
    std::__cxx11::string::~string((string *)&local_f0);
    std::__cxx11::string::~string((string *)&local_110);
    std::operator<<((ostream *)local_228,current_line._M_dataplus._M_p);
    local_21c = local_21c + 1;
  }
  std::__cxx11::string::~string((string *)&expr_name);
  std::__cxx11::string::~string((string *)&clause_label);
  std::__cxx11::string::~string((string *)&indent);
  std::__cxx11::string::~string((string *)&clause_kind);
  std::__cxx11::string::~string((string *)&current_line);
  return;
}

Assistant:

void OpenMPClause::generateDOT(std::ofstream& dot_file, int depth, int index, std::string parent_node) {

    std::string current_line;
    std::string clause_kind;
    std::string indent = std::string(depth, '\t');

    switch (this->getKind()) {
        case OMPC_private:
            clause_kind += "private";
            break;
        case OMPC_firstprivate:
            clause_kind += "firstprivate";
            break;
        case OMPC_shared:
            clause_kind += "shared";
            break;
        case OMPC_initializer:
            clause_kind += "initializer";
            break;
        case OMPC_num_threads:
            clause_kind += "num_threads";
            break;
        case OMPC_align:
            clause_kind += "align";
            break;
        case OMPC_num_teams:
            clause_kind += "num_teams";
            break;
        case OMPC_thread_limit:
            clause_kind += "thread_limit";
            break;
        case OMPC_default:
            clause_kind += "default";
            break;
        case OMPC_collapse:
            clause_kind += "collapse";
            break;
        case OMPC_ordered:
            clause_kind += "ordered";
            break;
        case OMPC_nowait:
            clause_kind += "nowait";
            break;
        case OMPC_allocate:
            clause_kind += "allocate";
            break;
        case OMPC_order:
            clause_kind += "order";
            break;
        case OMPC_safelen:
            clause_kind += "safelen";
            break;
        case OMPC_simdlen:
            clause_kind += "simdlen";
            break;
        case OMPC_aligned:
            clause_kind += "aligned";
            break;
        case OMPC_nontemporal:
            clause_kind += "nontemporal";
            break;
        case OMPC_uniform:
            clause_kind += "uniform";
            break;
        case OMPC_inbranch:
            clause_kind += "inbranch";
            break;
        case OMPC_notinbranch:
            clause_kind += "notinbranch";
            break;
        case OMPC_proc_bind:
            clause_kind += "proc_bind";
            break;
        case OMPC_bind:
            clause_kind += "bind";
            break; 
        case OMPC_inclusive:
            clause_kind += "inclusive";
            break;        
        case OMPC_exclusive:
            clause_kind += "exclusive";
            break;
        case OMPC_copyprivate:
            clause_kind += "copyprivate";
            break;
        case OMPC_parallel:
            clause_kind += "parallel";
            break;
        case OMPC_sections:
            clause_kind += "sections";
            break;
        case OMPC_for:
            clause_kind += "for";
            break;
        case OMPC_do:
            clause_kind += "do";
            break;
        case OMPC_taskgroup:
            clause_kind += "taskgroup";
            break;
        case OMPC_if:
            clause_kind += "if";
            break;
        case OMPC_reverse_offload:
            clause_kind += "reverse_offload";
            break;
        case OMPC_unified_address:
            clause_kind += "unified_address";
            break;
        case OMPC_unified_shared_memory:
            clause_kind += "unified_shared_memory";
            break;
        case OMPC_dynamic_allocators:
            clause_kind += "dynamic_allocators";
            break;
        case OMPC_final:
            clause_kind += "final";
            break;
        case OMPC_untied:
            clause_kind += "untied";
            break;
        case OMPC_mergeable:
            clause_kind += "mergeable";
            break;
        case OMPC_priority:
            clause_kind += "priority";
            break;
        case OMPC_detach:
            clause_kind += "detach";
            break;
        case OMPC_grainsize:
            clause_kind += "grainsize";
            break;
        case OMPC_num_tasks:
            clause_kind += "num_tasks";
            break;
        case OMPC_nogroup:
            clause_kind += "nogroup";
            break;
        case OMPC_map:
            clause_kind += "map";
            break;
        case OMPC_use_device_ptr:
            clause_kind += "use_device_ptr";
            break;
        case OMPC_use_device_addr:
            clause_kind += "use_device_addr";
            break;
        case OMPC_is_device_ptr:
            clause_kind += "is_device_ptr";
            break;
        case OMPC_has_device_addr:
            clause_kind += "has_device_addr";
            break;
        case OMPC_link:
            clause_kind += "link";
            break;
        case OMPC_device_type:
            clause_kind += "device_type";
            break;
        case OMPC_acq_rel:
            clause_kind += "acq_rel";
            break;
        case OMPC_release:
            clause_kind += "release";
            break;
        case OMPC_acquire:
            clause_kind += "acquire";
            break;
        case OMPC_read:
            clause_kind += "read";
            break;
        case OMPC_write:
            clause_kind += "write";
            break;
        case OMPC_update:
            clause_kind += "update";
            break;
        case OMPC_capture:
            clause_kind += "capture";
            break;
        case OMPC_seq_cst:
            clause_kind += "seq_cst";
            break;
        case OMPC_relaxed:
            clause_kind += "relaxed";
            break;
        case OMPC_hint:
            clause_kind += "hint";
            break;
        case OMPC_destroy:
            clause_kind += "destroy";
            break;
        case OMPC_threads:
            clause_kind += "threads";
            break;
        case OMPC_simd:
            clause_kind += "simd";
            break;
        case OMPC_uses_allocators:
            clause_kind += "uses_allocators";
            break;
        default:
            printf("The clause enum is not supported yet.\n");
    }
    //parent_node = parent_node.substr(0, parent_node.size()-1);
    std::string clause_label = clause_kind;
    clause_kind = parent_node + "_" + clause_kind + "_" + std::to_string(depth) + "_" + std::to_string(index);
    current_line = indent + parent_node + " -- " + clause_kind + "\n";
    dot_file << current_line.c_str();
    indent += "\t";
    current_line = indent + clause_kind + " [label = \"" + clause_label + + "\"]\n";
    dot_file << current_line.c_str();

    if (this->getKind() == OMPC_default) {
        OpenMPDirective* variant_directive = ((OpenMPDefaultClause*)this)->getVariantDirective();
        if (variant_directive != NULL) {
            variant_directive->generateDOT(dot_file, depth+1, 0, clause_kind, "");
        };
    };

    std::vector<const char*>* expr = this->getExpressions();
    if (expr != NULL) {
        std::vector<const char*>::iterator it;
        int expr_index = 0;
        std::string expr_name;
        for (it = expr->begin(); it != expr->end(); it++) {
            expr_name = clause_kind + "_expr" + std::to_string(expr_index);
            expr_index += 1;
            current_line = indent + clause_kind + " -- " + expr_name + "\n";
            dot_file << current_line.c_str();
            current_line = indent + "\t" + expr_name + " [label = \"" + "expr" + "\\n " + std::string(*it) + "\"]\n";
            dot_file << current_line.c_str();
        };
    };

}